

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::buildDescriptorSets
          (ComputeCacheTestInstance *this,deUint32 ndx)

{
  DeviceInterface *vk;
  VkDevice device;
  DescriptorPoolBuilder *this_00;
  long lVar1;
  Move<vk::Handle<(vk::HandleType)19>_> *this_01;
  Move<vk::Handle<(vk::HandleType)21>_> *this_02;
  deUint32 descriptorNdx;
  int iVar2;
  Location LVar3;
  Move<vk::Handle<(vk::HandleType)22>_> *this_03;
  bool bVar4;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_138;
  VkDescriptorSetAllocateInfo descriptorSetAllocInfo;
  DescriptorSetUpdateBuilder builder;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptorInfos;
  DescriptorSetLayoutBuilder descLayoutBuilder;
  
  vk = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&descLayoutBuilder);
  iVar2 = 2;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              (&descLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  }
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetAllocInfo,&descLayoutBuilder,vk,
             device,0);
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)descriptorSetAllocInfo.descriptorPool.m_internal;
  builder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)descriptorSetAllocInfo._24_8_;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descriptorSetAllocInfo._0_8_;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descriptorSetAllocInfo.pNext;
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetAllocInfo._4_4_ = 0;
  descriptorSetAllocInfo.pNext = (void *)0x0;
  descriptorSetAllocInfo.descriptorPool.m_internal = 0;
  descriptorSetAllocInfo.descriptorSetCount = 0;
  descriptorSetAllocInfo._28_4_ = 0;
  this_01 = this->m_descriptorSetLayout + ndx;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = (VkDevice)
             builder.m_writeDescriptorInfos.
             super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                builder.m_writes.
                super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       (deUint64)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetAllocInfo);
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_inputBuf).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                m_internal;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x800;
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
  emplace_back<vk::VkDescriptorBufferInfo>(&descriptorInfos,(VkDescriptorBufferInfo *)&builder);
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)this->m_outputBuf[ndx].super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                m_internal;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x800;
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
  emplace_back<vk::VkDescriptorBufferInfo>(&descriptorInfos,(VkDescriptorBufferInfo *)&builder);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_138);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_138,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&descriptorSetAllocInfo,this_00,vk,device,1,1)
  ;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)descriptorSetAllocInfo.descriptorPool.m_internal;
  builder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)descriptorSetAllocInfo._24_8_;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descriptorSetAllocInfo._0_8_;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descriptorSetAllocInfo.pNext;
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetAllocInfo._4_4_ = 0;
  descriptorSetAllocInfo.pNext = (void *)0x0;
  descriptorSetAllocInfo.descriptorPool.m_internal = 0;
  descriptorSetAllocInfo.descriptorSetCount = 0;
  descriptorSetAllocInfo._28_4_ = 0;
  this_02 = this->m_descriptorPool + ndx;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
       = (VkDevice)
         builder.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                builder.m_writes.
                super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       (deUint64)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&descriptorSetAllocInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_138);
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  descriptorSetAllocInfo.pNext = (void *)0x0;
  descriptorSetAllocInfo.descriptorPool.m_internal =
       (this_02->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal;
  descriptorSetAllocInfo.descriptorSetCount = 1;
  descriptorSetAllocInfo.pSetLayouts = (VkDescriptorSetLayout *)this_01;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_138,vk,device,&descriptorSetAllocInfo);
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138.m_data.deleter.m_device;
  builder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_138.m_data.deleter.m_pool.m_internal;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138.m_data.object.m_internal;
  builder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138.m_data.deleter.m_deviceIface;
  local_138.m_data.object.m_internal._0_4_ = 0;
  local_138.m_data.object.m_internal._4_4_ = 0;
  local_138.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_138.m_data.deleter.m_device = (VkDevice)0x0;
  local_138.m_data.deleter.m_pool.m_internal = 0;
  this_03 = this->m_descriptorSet + ndx;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&this_03->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
       = (VkDevice)
         builder.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = (deUint64)
               builder.m_writes.
               super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (this_03->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       (deUint64)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       builder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_138);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&builder);
  lVar1 = 0;
  LVar3.m_binding = 0;
  LVar3.m_arrayElement = 0;
  for (; LVar3 != (Location)0x2; LVar3 = (Location)((long)LVar3 + 1)) {
    local_138.m_data.object.m_internal = (deUint64)LVar3;
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (&builder,(VkDescriptorSet)
                        (this_03->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.
                        m_internal,(Location *)&local_138,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
               (VkDescriptorBufferInfo *)
               ((long)&((descriptorInfos.
                         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)->buffer).m_internal + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  ::vk::DescriptorSetUpdateBuilder::update(&builder,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&builder);
  std::_Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
  ~_Vector_base(&descriptorInfos.
                 super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               );
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&descLayoutBuilder);
  return;
}

Assistant:

void ComputeCacheTestInstance::buildDescriptorSets (deUint32 ndx)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create descriptor set layout
	DescriptorSetLayoutBuilder descLayoutBuilder;

	for (deUint32 bindingNdx = 0u; bindingNdx < 2u; bindingNdx++)
		descLayoutBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT);

	m_descriptorSetLayout[ndx] = descLayoutBuilder.build(vk, vkDevice);

	std::vector<VkDescriptorBufferInfo>        descriptorInfos;
	descriptorInfos.push_back(makeDescriptorBufferInfo(*m_inputBuf, 0u, sizeof(tcu::Vec4) * 128u));
	descriptorInfos.push_back(makeDescriptorBufferInfo(*m_outputBuf[ndx], 0u, sizeof(tcu::Vec4) * 128u));

	// Create descriptor pool
	m_descriptorPool[ndx] = DescriptorPoolBuilder().addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u).build(vk,
																										 vkDevice,
																										 VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
																										 1u);

	// Create descriptor set
	const VkDescriptorSetAllocateInfo descriptorSetAllocInfo =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,     // VkStructureType                 sType;
		DE_NULL,                                            // const void*                     pNext;
		*m_descriptorPool[ndx],                             // VkDescriptorPool                descriptorPool;
		1u,                                                 // deUint32                        setLayoutCount;
		&m_descriptorSetLayout[ndx].get(),                  // const VkDescriptorSetLayout*    pSetLayouts;
	};
	m_descriptorSet[ndx] = allocateDescriptorSet(vk, vkDevice, &descriptorSetAllocInfo);

	DescriptorSetUpdateBuilder  builder;
	for (deUint32 descriptorNdx = 0u; descriptorNdx < 2u; descriptorNdx++)
	{
		builder.writeSingle(*m_descriptorSet[ndx],
							DescriptorSetUpdateBuilder::Location::binding(descriptorNdx),
							VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
							&descriptorInfos[descriptorNdx]);
	}
	builder.update(vk, vkDevice);
}